

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall DropdownMenu::draw(DropdownMenu *this,RenderTarget *target,RenderStates states)

{
  bool bVar1;
  long in_RDI;
  TextButton *b;
  const_iterator __end2;
  const_iterator __begin2;
  vector<TextButton,_std::allocator<TextButton>_> *__range2;
  Transform *in_stack_ffffffffffffffb8;
  Transform *left;
  __normal_iterator<const_TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
  local_20;
  long local_18;
  
  left = (Transform *)&stack0x00000008;
  sf::Transformable::getTransform((Transformable *)__range2);
  sf::operator*=(left,in_stack_ffffffffffffffb8);
  sf::RenderTarget::draw
            ((RenderTarget *)states.transform.m_matrix._56_8_,
             (Drawable *)states.transform.m_matrix._48_8_,
             (RenderStates *)states.transform.m_matrix._40_8_);
  if ((*(byte *)(in_RDI + 0xb1) & 1) != 0) {
    sf::RenderTarget::draw
              ((RenderTarget *)states.transform.m_matrix._56_8_,
               (Drawable *)states.transform.m_matrix._48_8_,
               (RenderStates *)states.transform.m_matrix._40_8_);
    local_18 = in_RDI + 0x5c0;
    local_20._M_current =
         (TextButton *)
         std::vector<TextButton,_std::allocator<TextButton>_>::begin
                   ((vector<TextButton,_std::allocator<TextButton>_> *)in_stack_ffffffffffffffb8);
    std::vector<TextButton,_std::allocator<TextButton>_>::end
              ((vector<TextButton,_std::allocator<TextButton>_> *)in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                               *)left,(__normal_iterator<const_TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                                       *)in_stack_ffffffffffffffb8), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>::
      operator*(&local_20);
      sf::RenderTarget::draw
                ((RenderTarget *)states.transform.m_matrix._56_8_,
                 (Drawable *)states.transform.m_matrix._48_8_,
                 (RenderStates *)states.transform.m_matrix._40_8_);
      __gnu_cxx::
      __normal_iterator<const_TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>::
      operator++(&local_20);
    }
  }
  return;
}

Assistant:

void DropdownMenu::draw(RenderTarget& target, RenderStates states) const {
    states.transform *= getTransform();
    target.draw(button, states);
    if (visible) {
        target.draw(background, states);
        for (const TextButton& b : menuButtons) {
            target.draw(b, states);
        }
    }
}